

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

int __thiscall acto::core::runtime_t::shutdown(runtime_t *this,int __fd,int __how)

{
  mutex *__mutex;
  size_type sVar1;
  int extraout_EAX;
  binding_context_t *this_00;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  _Hash_node_base obj;
  __node_base *p_Var2;
  actors_set actors;
  
  this_00 = (binding_context_t *)
            (anonymous)::thread_context
                      (this,CONCAT44(in_register_00000034,__fd),CONCAT44(in_register_00000014,__how)
                      );
  anon_unknown_0::binding_context_t::process_actors(this_00,true);
  actors._M_h._M_buckets = &actors._M_h._M_single_bucket;
  actors._M_h._M_bucket_count = 1;
  actors._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  actors._M_h._M_element_count = 0;
  actors._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  actors._M_h._M_rehash_policy._M_next_resize = 0;
  actors._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __mutex = &this->mutex_;
  std::mutex::lock(__mutex);
  sVar1 = (this->actors_)._M_h._M_element_count;
  if (sVar1 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    obj._M_nxt = (_Hash_node_base *)&this->actors_;
    std::
    _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::operator=(&actors._M_h,
                (_Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)obj._M_nxt);
    p_Var2 = &actors._M_h._M_before_begin;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      obj._M_nxt = p_Var2[1]._M_nxt;
      deconstruct_object(this,(object_t *)obj._M_nxt);
    }
    event::wait(&this->no_actors_event_,obj._M_nxt);
  }
  std::
  _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&actors._M_h);
  if ((sVar1 != 0) && ((this->actors_)._M_h._M_element_count != 0)) {
    __assert_fail("actors_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                  ,0x137,"void acto::core::runtime_t::shutdown()");
  }
  return extraout_EAX;
}

Assistant:

void runtime_t::shutdown() {
  // Process all messages for binded actors and stop them.
  thread_context.process_actors(true);

  // Process shared actors.
  {
    actors_set actors;

    {
      std::lock_guard<std::mutex> g(mutex_);

      if (actors_.empty()) {
        return;
      } else {
        actors = actors_;
      }
    }

    for (auto ai = actors.cbegin(); ai != actors.cend(); ++ai) {
      deconstruct_object(*ai);
    }

    no_actors_event_.wait();
  }

  assert(actors_.empty());
}